

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::basic_param::help(basic_param *this,ostream *ostr,cstring *negation_prefix_)

{
  ulong uVar1;
  ostream *poVar2;
  basic_cstring<const_char> *in_RDX;
  ostream *in_RSI;
  long *in_RDI;
  basic_cstring<const_char> local_28;
  ostream *local_10;
  
  local_10 = in_RSI;
  unit_test::basic_cstring<const_char>::basic_cstring(&local_28,in_RDX);
  (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI,&local_28);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(local_10,'\n');
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 9));
    std::operator<<(poVar2,'\n');
  }
  return;
}

Assistant:

virtual void            help( std::ostream& ostr, cstring negation_prefix_ )
    {
        usage( ostr, negation_prefix_ );

        if( !p_help.empty() )
            ostr << '\n' << p_help << '\n';
    }